

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpecificStrategy.cpp
# Opt level: O1

ostream * operator<<(ostream *os,Stats *stats)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"instrs(",7);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)os,stats->instrs);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"), ",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"blocks(perfect: ",0x10);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,(stats->blocks).perfect);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", conflicts: ",0xd);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,(stats->blocks).conflict);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"), ",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"phantoms(",9);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,stats->phantoms);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"), ",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"edges(internal(perfect: ",0x18);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,(stats->edges).internal.perfect);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", conflicts: ",0xd);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,(stats->edges).internal.conflict);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"), external(perfect: ",0x15);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,(stats->edges).external.perfect);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", conflicts: ",0xd);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,(stats->edges).external.conflict);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")), ",4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"calls(",6);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,stats->calls);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"), ",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"indirects(",10);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,stats->indirects);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const SpecificStrategy::Stats& stats) {
	os << "instrs(" << stats.instrs << "), "
		<< "blocks(perfect: " << stats.blocks.perfect
			<< ", conflicts: " << stats.blocks.conflict << "), "
		<< "phantoms(" << stats.phantoms << "), "
		<< "edges(internal(perfect: " << stats.edges.internal.perfect
			<< ", conflicts: " << stats.edges.internal.conflict
			<< "), external(perfect: " << stats.edges.external.perfect
			<< ", conflicts: " << stats.edges.external.conflict << ")), "
		<< "calls(" << stats.calls << "), "
		<< "indirects(" << stats.indirects << ")";
	return os;
}